

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
* __thiscall
cfd::core::DescriptorNode::GetReferences
          (vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument,DescriptorNode *parent)

{
  pointer *this_00;
  uint uVar1;
  uint32_t flags_00;
  size_t sVar2;
  uint32_t derive_child_num;
  bool bVar3;
  DescriptorScriptType DVar4;
  size_type sVar5;
  iterator __first;
  iterator __last;
  reference pvVar6;
  long lVar7;
  unsigned_long uVar8;
  ulong uVar9;
  char *miniscript;
  uchar *script_00;
  CfdException *pCVar10;
  const_reference pvVar11;
  iterator __first_00;
  iterator __last_00;
  ScriptBuilder *pSVar12;
  __type local_1ae9;
  Script local_1ac0;
  SchnorrPubkey local_1a88;
  ByteData local_1a70;
  Script local_1a58;
  Script local_1a20;
  Script local_19e8;
  Script local_19b0;
  Script local_1978;
  undefined1 local_1940 [8];
  DescriptorScriptReference child_script;
  undefined1 local_15b8 [8];
  Pubkey pubkey_1;
  DescriptorKeyReference ref_2;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  keys_2;
  ByteData local_12e0;
  undefined1 local_12c8 [8];
  TaprootScriptTree tree;
  undefined1 local_11c0 [8];
  TapBranch branch;
  SchnorrPubkey pubkey;
  DescriptorKeyReference ref_1;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  keys_1;
  Script local_e50;
  undefined1 local_e18 [8];
  Script script_1;
  DescriptorScriptReference ref;
  bool local_a51;
  bool has_witness;
  Pubkey local_a40;
  DescriptorKeyReference local_a28;
  ulong local_798;
  size_t index;
  DescriptorKeyReference key_ref;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_> keys
  ;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  undefined1 local_4c8 [4];
  uint32_t reqnum;
  undefined1 local_490 [8];
  Address addr;
  allocator local_2d9;
  string local_2d8;
  CfdSourceLocation local_2b8;
  ByteData local_2a0;
  Script local_288;
  int local_250;
  uint32_t local_24c;
  int ret;
  uint32_t flags;
  size_t written;
  undefined1 local_238 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script;
  string local_218;
  CfdSourceLocation local_1f8;
  size_t local_1e0;
  size_t end_pos;
  string local_1d0;
  CfdSourceLocation local_1b0;
  undefined1 local_198 [8];
  string arg_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_14a;
  allocator local_149;
  string local_148;
  CfdSourceLocation local_128;
  uint32_t local_10c;
  undefined1 local_108 [4];
  uint32_t child_num;
  ScriptElement elem;
  Script locking_script;
  undefined1 local_60 [8];
  ScriptBuilder build;
  DescriptorNode *parent_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *array_argument_local;
  DescriptorNode *this_local;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  *result;
  
  if (((this->depth_ == 0) &&
      (array_argument !=
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0)) &&
     (sVar5 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(array_argument), 1 < sVar5)) {
    __first = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(array_argument);
    __last = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(array_argument);
    ::std::
    reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__last._M_current);
  }
  build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  ::std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::vector(__return_storage_ptr__);
  ScriptBuilder::ScriptBuilder((ScriptBuilder *)local_60);
  Script::Script((Script *)&elem.value_);
  if (this->node_type_ != kDescriptorTypeKey) {
    if (this->node_type_ == kDescriptorTypeNumber) {
      ScriptElement::ScriptElement((ScriptElement *)local_108,(ulong)this->number_);
      ScriptBuilder::AppendElement((ScriptBuilder *)local_60,(ScriptElement *)local_108);
      ScriptElement::~ScriptElement((ScriptElement *)local_108);
    }
    else if (this->node_type_ == kDescriptorTypeScript) {
      if (this->script_type_ == kDescriptorScriptMiniscript) {
        local_10c = 0;
        if (this->need_arg_num_ != 0) {
          if ((array_argument ==
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0) ||
             (bVar3 = ::std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::empty(array_argument), bVar3)) {
            local_128.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
                         ,0x2f);
            local_128.filename = local_128.filename + 1;
            local_128.line = 0x662;
            local_128.funcname = "GetReferences";
            logger::warn<>(&local_128,"Failed to generate miniscript from hdkey.");
            local_14a = 1;
            pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_148,"Failed to generate miniscript from hdkey.",&local_149);
            CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&local_148);
            local_14a = 0;
            __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
          }
          arg_value.field_2._M_local_buf[0xe] = '\0';
          arg_value.field_2._M_local_buf[0xd] = '\0';
          local_1ae9 = false;
          if (array_argument !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            bVar3 = ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty(array_argument);
            local_1ae9 = false;
            if (!bVar3) {
              pvVar6 = ::std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::at(array_argument,0);
              ::std::allocator<char>::allocator();
              arg_value.field_2._M_local_buf[0xe] = '\x01';
              ::std::__cxx11::string::string
                        ((string *)&local_170,"base",
                         (allocator *)(arg_value.field_2._M_local_buf + 0xf));
              arg_value.field_2._M_local_buf[0xd] = '\x01';
              local_1ae9 = ::std::operator==(pvVar6,&local_170);
            }
          }
          if ((arg_value.field_2._M_local_buf[0xd] & 1U) != 0) {
            ::std::__cxx11::string::~string((string *)&local_170);
          }
          if ((arg_value.field_2._M_local_buf[0xe] & 1U) != 0) {
            ::std::allocator<char>::~allocator
                      ((allocator<char> *)(arg_value.field_2._M_local_buf + 0xf));
          }
          if ((local_1ae9 == false) &&
             (array_argument !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0)) {
            pvVar6 = ::std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::back(array_argument);
            ::std::__cxx11::string::string((string *)local_198,(string *)pvVar6);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back(array_argument);
            lVar7 = ::std::__cxx11::string::rfind(local_198,0x73b162);
            if (lVar7 != -1) {
              local_1b0.filename =
                   strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
                           ,0x2f);
              local_1b0.filename = local_1b0.filename + 1;
              local_1b0.line = 0x66f;
              local_1b0.funcname = "GetReferences";
              logger::warn<>(&local_1b0,"Failed to invalid argument. miniscript is single child.");
              end_pos._6_1_ = 1;
              pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_1d0,
                         "Failed to invalid argument. miniscript is single child.",
                         (allocator *)((long)&end_pos + 7));
              CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&local_1d0);
              end_pos._6_1_ = 0;
              __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
            }
            local_1e0 = 0;
            uVar8 = ::std::__cxx11::stoul((string *)local_198,&local_1e0,10);
            sVar2 = local_1e0;
            local_10c = (uint32_t)uVar8;
            if ((local_1e0 != 0) && (uVar9 = ::std::__cxx11::string::size(), sVar2 < uVar9)) {
              local_1f8.filename =
                   strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
                           ,0x2f);
              local_1f8.filename = local_1f8.filename + 1;
              local_1f8.line = 0x678;
              local_1f8.funcname = "GetReferences";
              logger::warn<>(&local_1f8,"Failed to invalid argument. number only.");
              script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
              pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_218,"Failed to invalid argument. number only.",
                         (allocator *)
                         ((long)&script.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&local_218);
              script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
              __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
            }
            ::std::__cxx11::string::~string((string *)local_198);
          }
        }
        uVar1 = this->number_;
        ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&written + 7))
        ;
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238,(ulong)uVar1,
                   (allocator<unsigned_char> *)((long)&written + 7));
        ::std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)((long)&written + 7));
        _ret = 0;
        local_24c = 0;
        bVar3 = ::std::operator==(&this->parent_kind_,"tr");
        if (bVar3) {
          local_24c = 1;
        }
        miniscript = (char *)::std::__cxx11::string::c_str();
        derive_child_num = local_10c;
        flags_00 = local_24c;
        script_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
        sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
        local_250 = wally_descriptor_parse_miniscript
                              (miniscript,(char **)0x0,(char **)0x0,0,derive_child_num,flags_00,
                               script_00,sVar5,(size_t *)&ret);
        uVar9 = _ret;
        if ((local_250 != 0) ||
           (sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238),
           sVar5 < uVar9)) {
          local_2b8.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_descriptor.cpp"
                       ,0x2f);
          local_2b8.filename = local_2b8.filename + 1;
          local_2b8.line = 0x68a;
          local_2b8.funcname = "GetReferences";
          logger::warn<int&,unsigned_long&>
                    (&local_2b8,"Failed to parse miniscript.({}, size:{})",&local_250,
                     (unsigned_long *)&ret);
          pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_2d8,"Failed to parse miniscript.",&local_2d9);
          CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&local_2d8);
          __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
        }
        ByteData::ByteData(&local_2a0,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
        Script::Script(&local_288,&local_2a0);
        Script::operator=((Script *)&elem.value_,&local_288);
        Script::~Script(&local_288);
        ByteData::~ByteData(&local_2a0);
        ::std::
        vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
        ::
        emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                  ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                    *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                   &this->addr_prefixes_);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
      }
      else if (this->script_type_ == kDescriptorScriptRaw) {
        Script::Script((Script *)
                       &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       &this->value_);
        Script::operator=((Script *)&elem.value_,
                          (Script *)
                          &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        Script::~Script((Script *)
                        &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        ::std::
        vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
        ::
        emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                  ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                    *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                   &this->addr_prefixes_);
      }
      else if (this->script_type_ == kDescriptorScriptAddr) {
        core::Address::Address((Address *)local_490,&this->value_,&this->addr_prefixes_);
        ::std::
        vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
        ::
        emplace_back<cfd::core::Address&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                  ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                    *)__return_storage_ptr__,(Address *)local_490,&this->addr_prefixes_);
        core::Address::GetLockingScript((Script *)local_4c8,(Address *)local_490);
        Script::operator=((Script *)&elem.value_,(Script *)local_4c8);
        Script::~Script((Script *)local_4c8);
        core::Address::~Address((Address *)local_490);
      }
      else if ((this->script_type_ == kDescriptorScriptMulti) ||
              (this->script_type_ == kDescriptorScriptSortedMulti)) {
        pvVar11 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  operator[](&this->child_node_,0);
        pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = pvVar11->number_;
        ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                   &keys.
                    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  *)((long)&key_ref.argument_.field_2 + 8));
        DescriptorKeyReference::DescriptorKeyReference((DescriptorKeyReference *)&index);
        for (local_798 = 1; uVar9 = local_798,
            sVar5 = ::std::
                    vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                    size(&this->child_node_), uVar9 < sVar5; local_798 = local_798 + 1) {
          pvVar11 = ::std::
                    vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                    operator[](&this->child_node_,local_798);
          GetKeyReferences(&local_a28,pvVar11,array_argument);
          DescriptorKeyReference::operator=((DescriptorKeyReference *)&index,&local_a28);
          DescriptorKeyReference::~DescriptorKeyReference(&local_a28);
          ::std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::push_back((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                       *)((long)&key_ref.argument_.field_2 + 8),(value_type *)&index);
          DescriptorKeyReference::GetPubkey(&local_a40,(DescriptorKeyReference *)&index);
          ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back
                    ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                     &keys.
                      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a40);
          Pubkey::~Pubkey(&local_a40);
        }
        if (this->script_type_ == kDescriptorScriptSortedMulti) {
          this_00 = &keys.
                     super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __first_00 = ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::begin
                                 ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                                  this_00);
          __last_00 = ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::end
                                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                                 this_00);
          ::std::
          sort<__gnu_cxx::__normal_iterator<cfd::core::Pubkey*,std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>>,bool(*)(cfd::core::Pubkey_const&,cfd::core::Pubkey_const&)>
                    ((__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                      )__first_00._M_current,
                     (__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                      )__last_00._M_current,Pubkey::IsLarge);
        }
        local_a51 = false;
        if ((parent != (DescriptorNode *)0x0) &&
           (DVar4 = GetScriptType(parent), DVar4 == kDescriptorScriptWsh)) {
          local_a51 = true;
        }
        ScriptUtil::CreateMultisigRedeemScript
                  ((Script *)
                   &ref.addr_prefixes_.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                   (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                   &keys.
                    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_a51);
        Script::operator=((Script *)&elem.value_,
                          (Script *)
                          &ref.addr_prefixes_.
                           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        Script::~Script((Script *)
                        &ref.addr_prefixes_.
                         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::
        vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
        ::
        emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&,unsigned_int&>
                  ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                    *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                   (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    *)((long)&key_ref.argument_.field_2 + 8),&this->addr_prefixes_,
                   (uint *)((long)&pubkeys.
                                   super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)&index);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)((long)&key_ref.argument_.field_2 + 8));
        ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                   &keys.
                    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else if ((this->script_type_ == kDescriptorScriptSh) ||
              (this->script_type_ == kDescriptorScriptWsh)) {
        pvVar11 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  operator[](&this->child_node_,0);
        GetReference((DescriptorScriptReference *)
                     &script_1.script_stack_.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11,array_argument,this
                    );
        DescriptorScriptReference::GetLockingScript
                  ((Script *)local_e18,
                   (DescriptorScriptReference *)
                   &script_1.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (this->script_type_ == kDescriptorScriptWsh) {
          ScriptUtil::CreateP2wshLockingScript(&local_e50,(Script *)local_e18);
          Script::operator=((Script *)&elem.value_,&local_e50);
          Script::~Script(&local_e50);
        }
        else {
          ScriptUtil::CreateP2shLockingScript
                    ((Script *)
                     &keys_1.
                      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_e18);
          Script::operator=((Script *)&elem.value_,
                            (Script *)
                            &keys_1.
                             super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Script::~Script((Script *)
                          &keys_1.
                           super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        ::std::
        vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
        ::
        emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,cfd::core::DescriptorScriptReference&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                  ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                    *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                   (DescriptorScriptReference *)
                   &script_1.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->addr_prefixes_);
        Script::~Script((Script *)local_e18);
        DescriptorScriptReference::~DescriptorScriptReference
                  ((DescriptorScriptReference *)
                   &script_1.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else if (this->script_type_ == kDescriptorScriptTaproot) {
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  *)((long)&ref_1.argument_.field_2 + 8));
        pvVar11 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  operator[](&this->child_node_,0);
        GetKeyReferences((DescriptorKeyReference *)
                         &pubkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,pvVar11,array_argument);
        DescriptorKeyReference::GetSchnorrPubkey
                  ((SchnorrPubkey *)
                   &branch.branch_list_.
                    super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (DescriptorKeyReference *)
                   &pubkey.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::push_back((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)((long)&ref_1.argument_.field_2 + 8),
                    (value_type *)
                    &pubkey.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        TapBranch::TapBranch((TapBranch *)local_11c0);
        sVar5 = ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                ::size(&this->child_node_);
        if (1 < sVar5) {
          pvVar11 = ::std::
                    vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                    operator[](&this->child_node_,1);
          GetTapBranch((TapBranch *)
                       &tree.nodes_.
                        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11,array_argument);
          TapBranch::operator=
                    ((TapBranch *)local_11c0,
                     (TapBranch *)
                     &tree.nodes_.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          TapBranch::~TapBranch
                    ((TapBranch *)
                     &tree.nodes_.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        bVar3 = TapBranch::HasTapLeaf((TapBranch *)local_11c0);
        if (bVar3) {
          TaprootScriptTree::TaprootScriptTree
                    ((TaprootScriptTree *)local_12c8,(TapBranch *)local_11c0);
          TaprootUtil::CreateTapScriptControl
                    (&local_12e0,
                     (SchnorrPubkey *)
                     &branch.branch_list_.
                      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(TapBranch *)local_12c8,
                     (SchnorrPubkey *)0x0,(Script *)&elem.value_);
          ByteData::~ByteData(&local_12e0);
          ::std::
          vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
          ::
          emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,cfd::core::TaprootScriptTree&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                    ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                      *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                     (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)((long)&ref_1.argument_.field_2 + 8),(TaprootScriptTree *)local_12c8,
                     &this->addr_prefixes_);
          TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)local_12c8);
        }
        else {
          TaprootUtil::CreateTapScriptControl
                    ((ByteData *)
                     &keys_2.
                      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (SchnorrPubkey *)
                     &branch.branch_list_.
                      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(TapBranch *)local_11c0,
                     (SchnorrPubkey *)0x0,(Script *)&elem.value_);
          ByteData::~ByteData((ByteData *)
                              &keys_2.
                               super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ::std::
          vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
          ::
          emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,cfd::core::TapBranch&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                    ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                      *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                     (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)((long)&ref_1.argument_.field_2 + 8),(TapBranch *)local_11c0,
                     &this->addr_prefixes_);
        }
        TapBranch::~TapBranch((TapBranch *)local_11c0);
        SchnorrPubkey::~SchnorrPubkey
                  ((SchnorrPubkey *)
                   &branch.branch_list_.
                    super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        DescriptorKeyReference::~DescriptorKeyReference
                  ((DescriptorKeyReference *)
                   &pubkey.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)((long)&ref_1.argument_.field_2 + 8));
      }
      else {
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  *)((long)&ref_2.argument_.field_2 + 8));
        pvVar11 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  operator[](&this->child_node_,0);
        GetKeyReferences((DescriptorKeyReference *)
                         &pubkey_1.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,pvVar11,array_argument);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::push_back((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)((long)&ref_2.argument_.field_2 + 8),
                    (value_type *)
                    &pubkey_1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        DescriptorKeyReference::GetPubkey
                  ((Pubkey *)local_15b8,
                   (DescriptorKeyReference *)
                   &pubkey_1.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        if (this->script_type_ == kDescriptorScriptCombo) {
          bVar3 = Pubkey::IsCompress((Pubkey *)local_15b8);
          if (bVar3) {
            ScriptUtil::CreateP2wpkhLockingScript
                      ((Script *)
                       &child_script.addr_prefixes_.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_15b8);
            Script::operator=((Script *)&elem.value_,
                              (Script *)
                              &child_script.addr_prefixes_.
                               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            Script::~Script((Script *)
                            &child_script.addr_prefixes_.
                             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::
            vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
            ::
            emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                      ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                        *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                       (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                        *)((long)&ref_2.argument_.field_2 + 8),&this->addr_prefixes_);
            DescriptorScriptReference::DescriptorScriptReference
                      ((DescriptorScriptReference *)local_1940,(Script *)&elem.value_,
                       kDescriptorScriptWpkh,
                       (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                        *)((long)&ref_2.argument_.field_2 + 8),&this->addr_prefixes_,0);
            ScriptUtil::CreateP2shLockingScript(&local_1978,(Script *)&elem.value_);
            Script::operator=((Script *)&elem.value_,&local_1978);
            Script::~Script(&local_1978);
            ::std::
            vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
            ::
            emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,cfd::core::DescriptorScriptReference&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                      ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                        *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                       (DescriptorScriptReference *)local_1940,&this->addr_prefixes_);
            DescriptorScriptReference::~DescriptorScriptReference
                      ((DescriptorScriptReference *)local_1940);
          }
          ScriptUtil::CreateP2pkhLockingScript(&local_19b0,(Pubkey *)local_15b8);
          Script::operator=((Script *)&elem.value_,&local_19b0);
          Script::~Script(&local_19b0);
          ::std::
          vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
          ::
          emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                    ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                      *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                     (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)((long)&ref_2.argument_.field_2 + 8),&this->addr_prefixes_);
          pSVar12 = ScriptBuilder::operator<<((ScriptBuilder *)local_60,(Pubkey *)local_15b8);
          ScriptBuilder::operator<<(pSVar12,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
          ScriptBuilder::Build(&local_19e8,(ScriptBuilder *)local_60);
          Script::operator=((Script *)&elem.value_,&local_19e8);
          Script::~Script(&local_19e8);
          ::std::
          vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
          ::
          emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                    ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                      *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                     (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)((long)&ref_2.argument_.field_2 + 8),&this->addr_prefixes_);
        }
        else {
          if (this->script_type_ == kDescriptorScriptPkh) {
            ScriptUtil::CreateP2pkhLockingScript(&local_1a20,(Pubkey *)local_15b8);
            Script::operator=((Script *)&elem.value_,&local_1a20);
            Script::~Script(&local_1a20);
          }
          else if (this->script_type_ == kDescriptorScriptWpkh) {
            ScriptUtil::CreateP2wpkhLockingScript(&local_1a58,(Pubkey *)local_15b8);
            Script::operator=((Script *)&elem.value_,&local_1a58);
            Script::~Script(&local_1a58);
          }
          else if (this->script_type_ == kDescriptorScriptPk) {
            bVar3 = ::std::operator==(&this->parent_kind_,"tr");
            if (bVar3) {
              SchnorrPubkey::FromPubkey(&local_1a88,(Pubkey *)local_15b8,(bool *)0x0);
              SchnorrPubkey::GetData(&local_1a70,&local_1a88);
              pSVar12 = ScriptBuilder::operator<<((ScriptBuilder *)local_60,&local_1a70);
              ScriptBuilder::operator<<(pSVar12,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
              ByteData::~ByteData(&local_1a70);
              SchnorrPubkey::~SchnorrPubkey(&local_1a88);
            }
            else {
              pSVar12 = ScriptBuilder::operator<<((ScriptBuilder *)local_60,(Pubkey *)local_15b8);
              ScriptBuilder::operator<<(pSVar12,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
            }
            ScriptBuilder::Build(&local_1ac0,(ScriptBuilder *)local_60);
            Script::operator=((Script *)&elem.value_,&local_1ac0);
            Script::~Script(&local_1ac0);
          }
          ::std::
          vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
          ::
          emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                    ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                      *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                     (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)((long)&ref_2.argument_.field_2 + 8),&this->addr_prefixes_);
        }
        Pubkey::~Pubkey((Pubkey *)local_15b8);
        DescriptorKeyReference::~DescriptorKeyReference
                  ((DescriptorKeyReference *)
                   &pubkey_1.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)((long)&ref_2.argument_.field_2 + 8));
      }
    }
  }
  build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  Script::~Script((Script *)&elem.value_);
  ScriptBuilder::~ScriptBuilder((ScriptBuilder *)local_60);
  if ((build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    ::std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<DescriptorScriptReference> DescriptorNode::GetReferences(
    std::vector<std::string>* array_argument,
    const DescriptorNode* parent) const {
  if ((depth_ == 0) && (array_argument) && (array_argument->size() > 1)) {
    std::reverse(array_argument->begin(), array_argument->end());
  }
  std::vector<DescriptorScriptReference> result;
  ScriptBuilder build;
  Script locking_script;

  if (node_type_ == DescriptorNodeType::kDescriptorTypeKey) {
    // do nothing
  } else if (node_type_ == DescriptorNodeType::kDescriptorTypeNumber) {
    ScriptElement elem(static_cast<int64_t>(number_));
    build.AppendElement(elem);
  } else if (node_type_ == DescriptorNodeType::kDescriptorTypeScript) {
    if (script_type_ == DescriptorScriptType::kDescriptorScriptMiniscript) {
      uint32_t child_num = 0;
      if (need_arg_num_ == 0) {
        // do nothing
      } else if ((array_argument == nullptr) || array_argument->empty()) {
        warn(CFD_LOG_SOURCE, "Failed to generate miniscript from hdkey.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to generate miniscript from hdkey.");
      } else if (
          (array_argument != nullptr) && (!array_argument->empty()) &&
          (array_argument->at(0) == std::string(kArgumentBaseExtkey))) {
        // do nothing
      } else if (array_argument != nullptr) {
        std::string arg_value = array_argument->back();
        array_argument->pop_back();
        if (arg_value.rfind("/") != std::string::npos) {
          warn(
              CFD_LOG_SOURCE,
              "Failed to invalid argument. miniscript is single child.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to invalid argument. miniscript is single child.");
        }
        std::size_t end_pos = 0;
        child_num = static_cast<uint32_t>(std::stoul(arg_value, &end_pos, 10));
        if ((end_pos != 0) && (end_pos < arg_value.size())) {
          warn(CFD_LOG_SOURCE, "Failed to invalid argument. number only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to invalid argument. number only.");
        }
      }
      std::vector<uint8_t> script(number_);
      size_t written = 0;
      uint32_t flags = 0;
      if (parent_kind_ == "tr") flags = WALLY_MINISCRIPT_TAPSCRIPT;
      int ret = wally_descriptor_parse_miniscript(
          value_.c_str(), nullptr, nullptr, 0, child_num, flags, script.data(),
          script.size(), &written);
      if ((ret == WALLY_OK) && (written <= script.size())) {
        locking_script = Script(script);
        result.emplace_back(locking_script, script_type_, addr_prefixes_);
      } else {
        warn(
            CFD_LOG_SOURCE, "Failed to parse miniscript.({}, size:{})", ret,
            written);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Failed to parse miniscript.");
      }
    } else if (script_type_ == DescriptorScriptType::kDescriptorScriptRaw) {
      locking_script = Script(value_);
      result.emplace_back(locking_script, script_type_, addr_prefixes_);
    } else if (script_type_ == DescriptorScriptType::kDescriptorScriptAddr) {
      Address addr(value_, addr_prefixes_);
      result.emplace_back(addr, addr_prefixes_);
      locking_script = addr.GetLockingScript();
    } else if (
        (script_type_ == DescriptorScriptType::kDescriptorScriptMulti) ||
        (script_type_ == DescriptorScriptType::kDescriptorScriptSortedMulti)) {
      uint32_t reqnum = child_node_[0].number_;
      std::vector<Pubkey> pubkeys;
      std::vector<DescriptorKeyReference> keys;
      DescriptorKeyReference key_ref;
      for (size_t index = 1; index < child_node_.size(); ++index) {
        key_ref = child_node_[index].GetKeyReferences(array_argument);
        keys.push_back(key_ref);
        pubkeys.push_back(key_ref.GetPubkey());
      }
      if (script_type_ == DescriptorScriptType::kDescriptorScriptSortedMulti) {
        // https://github.com/bitcoin/bips/blob/master/bip-0067.mediawiki
        std::sort(pubkeys.begin(), pubkeys.end(), Pubkey::IsLarge);
      }
      bool has_witness = false;
      if ((parent != nullptr) &&
          (parent->GetScriptType() ==
           DescriptorScriptType::kDescriptorScriptWsh)) {
        has_witness = true;
      }
      locking_script =
          ScriptUtil::CreateMultisigRedeemScript(reqnum, pubkeys, has_witness);
      result.emplace_back(
          locking_script, script_type_, keys, addr_prefixes_, reqnum);
    } else if (
        (script_type_ == DescriptorScriptType::kDescriptorScriptSh) ||
        (script_type_ == DescriptorScriptType::kDescriptorScriptWsh)) {
      DescriptorScriptReference ref =
          child_node_[0].GetReference(array_argument, this);
      Script script = ref.GetLockingScript();
      if (script_type_ == DescriptorScriptType::kDescriptorScriptWsh) {
        locking_script = ScriptUtil::CreateP2wshLockingScript(script);
      } else {
        locking_script = ScriptUtil::CreateP2shLockingScript(script);
      }
      result.emplace_back(locking_script, script_type_, ref, addr_prefixes_);
    } else if (
        script_type_ == DescriptorScriptType::kDescriptorScriptTaproot) {
      std::vector<DescriptorKeyReference> keys;
      DescriptorKeyReference ref =
          child_node_[0].GetKeyReferences(array_argument);
      SchnorrPubkey pubkey = ref.GetSchnorrPubkey();
      keys.push_back(ref);
      TapBranch branch;
      if (child_node_.size() >= 2) {
        branch = child_node_[1].GetTapBranch(array_argument);
      }
      if (branch.HasTapLeaf()) {
        TaprootScriptTree tree(branch);
        TaprootUtil::CreateTapScriptControl(
            pubkey, tree, nullptr, &locking_script);
        result.emplace_back(
            locking_script, script_type_, keys, tree, addr_prefixes_);
      } else {
        TaprootUtil::CreateTapScriptControl(
            pubkey, branch, nullptr, &locking_script);
        result.emplace_back(
            locking_script, script_type_, keys, branch, addr_prefixes_);
      }
    } else {
      std::vector<DescriptorKeyReference> keys;
      DescriptorKeyReference ref =
          child_node_[0].GetKeyReferences(array_argument);
      keys.push_back(ref);
      Pubkey pubkey = ref.GetPubkey();
      if (script_type_ == DescriptorScriptType::kDescriptorScriptCombo) {
        if (pubkey.IsCompress()) {
          // p2wpkh
          locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
          result.emplace_back(
              locking_script, script_type_, keys, addr_prefixes_);

          // p2sh-p2wpkh
          DescriptorScriptReference child_script(
              locking_script, DescriptorScriptType::kDescriptorScriptWpkh,
              keys, addr_prefixes_);
          locking_script = ScriptUtil::CreateP2shLockingScript(locking_script);
          result.emplace_back(
              locking_script, script_type_, child_script, addr_prefixes_);
        }

        // p2pkh
        locking_script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
        result.emplace_back(
            locking_script, script_type_, keys, addr_prefixes_);

        // p2pk
        build << pubkey << ScriptOperator::OP_CHECKSIG;
        locking_script = build.Build();
        result.emplace_back(
            locking_script, script_type_, keys, addr_prefixes_);
      } else {
        if (script_type_ == DescriptorScriptType::kDescriptorScriptPkh) {
          locking_script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
        } else if (
            script_type_ == DescriptorScriptType::kDescriptorScriptWpkh) {
          locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
        } else if (script_type_ == DescriptorScriptType::kDescriptorScriptPk) {
          if (parent_kind_ == "tr") {
            build << SchnorrPubkey::FromPubkey(pubkey).GetData()
                  << ScriptOperator::OP_CHECKSIG;
          } else {
            build << pubkey << ScriptOperator::OP_CHECKSIG;
          }
          locking_script = build.Build();
        }
        result.emplace_back(
            locking_script, script_type_, keys, addr_prefixes_);
      }
    }
  } else {
    // do nothing
  }

  return result;
}